

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
trial::protocol::bintoken::
format<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<char>>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          bintoken *this,basic_variable<std::allocator<char>_> *data)

{
  basic_formatter<std::allocator<char>_> vis;
  writer writer;
  basic_formatter<std::allocator<char>_> local_80;
  type local_78;
  type local_68 [5];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  basic_writer<16ul>::basic_writer<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_writer<16ul> *)&local_78.__align,__return_storage_ptr__);
  local_80.writer = (writer *)&local_78;
  dynamic::
  visit<trial::protocol::bintoken::detail::basic_formatter<std::allocator<char>>&,std::allocator<char>>
            (&local_80,(basic_variable<std::allocator<char>_> *)this);
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)&local_68[0].__align);
  (**(code **)local_78._0_8_)(&local_78);
  return __return_storage_ptr__;
}

Assistant:

auto format(const trial::dynamic::basic_variable<Allocator>& data) -> T
{
    T result;
    bintoken::writer writer(result);
    partial::format(data, writer);
    return result;
}